

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_24939c::StdQualifiedName::printLeft(StdQualifiedName *this,OutputStream *S)

{
  StringView local_28;
  OutputStream *local_18;
  OutputStream *S_local;
  StdQualifiedName *this_local;
  
  local_18 = S;
  S_local = (OutputStream *)this;
  StringView::StringView(&local_28,"std::");
  OutputStream::operator+=(local_18,local_28);
  Node::print(this->Child,local_18);
  return;
}

Assistant:

void printLeft(OutputStream &S) const override {
    S += "std::";
    Child->print(S);
  }